

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Welcome.cpp
# Opt level: O2

void Handlers::Welcome_Agree(Player *player,PacketReader *reader)

{
  uchar uVar1;
  bool bVar2;
  runtime_error *this;
  InitReply init_reply;
  int id;
  FileType type;
  EOClient *this_00;
  
  uVar1 = PacketReader::GetChar(reader);
  switch(uVar1) {
  case '\x01':
    this_00 = player->client;
    id = (int)player->character->mapid;
    type = FILE_MAP;
    init_reply = INIT_FILE_MAP;
    break;
  case '\x02':
    this_00 = player->client;
    id = this_00->next_eif_id;
    this_00->next_eif_id = id + 1;
    type = FILE_ITEM;
    init_reply = INIT_FILE_EIF;
    break;
  case '\x03':
    this_00 = player->client;
    id = this_00->next_enf_id;
    this_00->next_enf_id = id + 1;
    type = FILE_NPC;
    init_reply = INIT_FILE_ENF;
    break;
  case '\x04':
    this_00 = player->client;
    id = this_00->next_esf_id;
    this_00->next_esf_id = id + 1;
    type = FILE_SPELL;
    init_reply = INIT_FILE_ESF;
    break;
  case '\x05':
    this_00 = player->client;
    id = this_00->next_ecf_id;
    this_00->next_ecf_id = id + 1;
    type = FILE_CLASS;
    init_reply = INIT_FILE_ECF;
    break;
  default:
    goto switchD_00154796_default;
  }
  bVar2 = EOClient::Upload(this_00,type,id,init_reply);
  if (!bVar2) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Failed to upload file");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
switchD_00154796_default:
  return;
}

Assistant:

void Welcome_Agree(Player *player, PacketReader &reader)
{
	FileType file = FileType(reader.GetChar());
	bool result = false;

	switch (file)
	{
		case FILE_MAP: result = player->client->Upload(FILE_MAP, player->character->mapid, INIT_FILE_MAP); break;
		case FILE_ITEM: result = player->client->Upload(FILE_ITEM, player->client->next_eif_id++, INIT_FILE_EIF); break;
		case FILE_NPC: result = player->client->Upload(FILE_NPC, player->client->next_enf_id++, INIT_FILE_ENF); break;
		case FILE_SPELL: result = player->client->Upload(FILE_SPELL, player->client->next_esf_id++, INIT_FILE_ESF); break;
		case FILE_CLASS: result = player->client->Upload(FILE_CLASS, player->client->next_ecf_id++, INIT_FILE_ECF); break;
		default: return;
	}

	if (!result)
		throw std::runtime_error("Failed to upload file");
}